

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  uint index_1;
  Value *childValue;
  uint index;
  bool hasChildValue;
  bool isArrayMultiLine;
  uint size;
  ArrayIndex in_stack_00000124;
  Value *in_stack_00000128;
  Value *in_stack_00000178;
  StyledStreamWriter *in_stack_00000180;
  string *in_stack_ffffffffffffff28;
  StyledStreamWriter *in_stack_ffffffffffffff30;
  pointer pbVar4;
  StyledStreamWriter *this_00;
  Value *in_stack_ffffffffffffff48;
  allocator *paVar5;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff5c;
  StyledStreamWriter *in_stack_ffffffffffffff60;
  uint local_78;
  allocator<char> local_71;
  string local_70 [8];
  Value *in_stack_ffffffffffffff98;
  StyledStreamWriter *in_stack_ffffffffffffffa0;
  allocator local_39;
  string local_38 [56];
  
  local_38._36_4_ = Value::size(in_stack_ffffffffffffff48);
  if (local_38._36_4_ == 0) {
    paVar5 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"[]",paVar5);
    pushValue(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    bVar1 = isMultineArray(in_stack_ffffffffffffff60,
                           (Value *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar1) {
      this_00 = (StyledStreamWriter *)&local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"[",(allocator *)this_00);
      writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      indent((StyledStreamWriter *)0x13330e);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this_00->childValues_);
      local_78 = 0;
      while( true ) {
        Value::operator[](in_stack_00000128,in_stack_00000124);
        writeCommentBeforeValue(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          if ((*(byte *)&in_RDI[4].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish >> 1 & 1) == 0) {
            writeIndent(in_stack_ffffffffffffff30);
          }
          *(byte *)&in_RDI[4].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
               *(byte *)&in_RDI[4].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 0xfd | 2;
          writeValue(in_stack_00000180,in_stack_00000178);
          *(byte *)&in_RDI[4].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
               *(byte *)&in_RDI[4].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 0xfd;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_RDI,(ulong)local_78);
          writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        local_78 = local_78 + 1;
        if (local_78 == local_38._36_4_) break;
        std::operator<<((ostream *)
                        in_RDI[1].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,",");
        writeCommentAfterValueOnSameLine(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      writeCommentAfterValueOnSameLine(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      unindent(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff60,"]",(allocator *)&stack0xffffffffffffff5f);
      writeWithIndent(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    }
    else {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI);
      if (sVar2 != (uint)local_38._36_4_) {
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x2ad,"void Json::StyledStreamWriter::writeArrayValue(const Value &)");
      }
      std::operator<<((ostream *)
                      in_RDI[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,"[ ");
      for (uVar6 = 0; uVar6 < (uint)local_38._36_4_; uVar6 = uVar6 + 1) {
        if (uVar6 != 0) {
          std::operator<<((ostream *)
                          in_RDI[1].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,", ");
        }
        pbVar4 = in_RDI[1].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](in_RDI,(ulong)uVar6);
        std::operator<<((ostream *)pbVar4,(string *)pvVar3);
      }
      std::operator<<((ostream *)
                      in_RDI[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start," ]");
    }
  }
  return;
}

Assistant:

void StyledStreamWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_) writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *document_ << "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *document_ << ", ";
        *document_ << childValues_[index];
      }
      *document_ << " ]";
    }
  }
}